

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O2

void * __thiscall
SecurityDirWrapper::getFieldPtr(SecurityDirWrapper *this,size_t fId,size_t subField)

{
  int iVar1;
  WIN_CERTIFICATE *pWVar2;
  undefined4 extraout_var;
  
  pWVar2 = getCert(this);
  if (pWVar2 == (WIN_CERTIFICATE *)0x0) {
    pWVar2 = (WIN_CERTIFICATE *)0x0;
  }
  else {
    switch(fId) {
    case 0:
      break;
    case 1:
      pWVar2 = (WIN_CERTIFICATE *)&pWVar2->wRevision;
      break;
    case 2:
      pWVar2 = (WIN_CERTIFICATE *)&pWVar2->wCertificateType;
      break;
    case 3:
      pWVar2 = (WIN_CERTIFICATE *)pWVar2->bCertificate;
      break;
    default:
      iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])
                        (this);
      return (void *)CONCAT44(extraout_var,iVar1);
    }
  }
  return pWVar2;
}

Assistant:

void* SecurityDirWrapper::getFieldPtr(size_t fId, size_t subField)
{
    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return 0;

    switch (fId) {
        case CERT_LEN : return &cert->dwLength;
        case REVISION : return &cert->wRevision;
        case TYPE : return &cert->wCertificateType;
        case CERT_CONTENT : return &cert->bCertificate;
    }
    return this->getPtr();
}